

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

QDockWidgetGroupWindow * __thiscall
QMainWindowLayout::createTabbedDockWindow(QMainWindowLayout *this)

{
  QDockWidgetGroupWindow *parent;
  QWidget *parent_00;
  QDockWidgetGroupLayout *this_00;
  
  parent = (QDockWidgetGroupWindow *)operator_new(0x58);
  parent_00 = QLayout::parentWidget((QLayout *)this);
  QWidget::QWidget((QWidget *)parent,parent_00,(WindowFlags)0xb);
  *(undefined ***)&parent->super_QWidget = &PTR_metaObject_00803378;
  *(undefined ***)&(parent->super_QWidget).super_QPaintDevice =
       &PTR__QDockWidgetGroupWindow_00803528;
  (parent->currentGapRect).x1 = 0;
  (parent->currentGapRect).y1 = 0;
  (parent->currentGapRect).x2 = -1;
  (parent->currentGapRect).y2 = -1;
  (parent->currentGapPos).d.d = (Data *)0x0;
  (parent->currentGapPos).d.ptr = (int *)0x0;
  (parent->currentGapPos).d.size = 0;
  (parent->m_removedFrameSize).wd = -1;
  (parent->m_removedFrameSize).ht = -1;
  this_00 = (QDockWidgetGroupLayout *)operator_new(0x170);
  QDockWidgetGroupLayout::QDockWidgetGroupLayout(this_00,parent);
  return parent;
}

Assistant:

QDockWidgetGroupWindow *QMainWindowLayout::createTabbedDockWindow()
{
    QDockWidgetGroupWindow* f = new QDockWidgetGroupWindow(parentWidget(), Qt::Tool);
    new QDockWidgetGroupLayout(f);
    return f;
}